

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTPNStmTop * __thiscall
CTcParser::parse_function
          (CTcParser *this,int *err,int is_extern,int replace,int modify,int func_kw_present)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  tc_toktyp_t tVar3;
  tc_symtype_t tVar4;
  int iVar5;
  newline_spacing_mode_t nVar6;
  uint uVar7;
  CTcToken *pCVar8;
  CTcSymFunc *pCVar9;
  size_t sVar10;
  char *pcVar11;
  CTPNCodeBody *pCVar12;
  CTcSymFunc *pCVar13;
  CTcSymFunc *pCVar14;
  undefined4 extraout_var;
  CTcSymFunc *f;
  undefined4 extraout_var_00;
  int in_ECX;
  int in_EDX;
  CTcTokenizer *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  CTcSymFunc *mod_sym;
  CTcSymFunc *mod_base;
  int err_1;
  int is_method;
  CTcFormalTypeList *type_list;
  long sym_linenum;
  CTcTokFileDesc *sym_file;
  int redef;
  int has_retval;
  CTcSymLocal *varargs_list_local;
  int varargs_list;
  int varargs;
  int opt_argc;
  int argc;
  int has_proto;
  CTPNCodeBody *code_body;
  CTcSymFunc *func_sym;
  CTcToken tok;
  undefined8 in_stack_fffffffffffffd78;
  CTcTokenizer *in_stack_fffffffffffffd80;
  undefined4 uVar15;
  CTcTokenizer *in_stack_fffffffffffffd88;
  undefined4 uVar16;
  CTcPrsSymtab *in_stack_fffffffffffffd90;
  undefined4 uVar17;
  CTcTokenizer *in_stack_fffffffffffffd98;
  CTcToken *in_stack_fffffffffffffda0;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  CTcFormalTypeList *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  char *in_stack_fffffffffffffdc0;
  CTcSymFunc *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  CTcMain *pCVar19;
  bool local_18b;
  byte local_18a;
  byte local_189;
  byte local_171;
  int *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  CTcTokenizer **this_00;
  undefined4 in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff10;
  CTcSymLocal **in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  uint uVar20;
  CTcFormalTypeList **type_list_00;
  CVmHashEntry *in_stack_ffffffffffffff40;
  CVmHashEntry *pCVar21;
  CTcTokFileDesc *in_stack_ffffffffffffff48;
  CTcTokFileDesc *pCVar22;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  CTcPrsSymtab *in_stack_ffffffffffffff58;
  tcprs_codebodytype in_stack_ffffffffffffff60;
  undefined4 local_9c;
  newline_spacing_mode_t in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  tctok_incfile_t *in_stack_ffffffffffffff78;
  CTPNCodeBody *this_01;
  CTcSymFunc *in_stack_ffffffffffffff80;
  CTcSymFunc *local_78;
  CTcTokFileDesc *pCStack_70;
  array_list_ele_t *local_68;
  CTcTokFileDesc *pCStack_60;
  undefined1 local_58;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  CTcTokenizer *local_38;
  CTPNCodeBody *local_28;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  local_48 = in_R9D;
  local_44 = in_R8D;
  local_40 = in_ECX;
  local_3c = in_EDX;
  local_38 = in_RSI;
  CTcToken::CTcToken((CTcToken *)&local_78);
  bVar1 = true;
  type_list_00 = (CTcFormalTypeList **)0x0;
  uVar20 = 0;
  if (local_48 != 0) {
    tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x215e13);
    uVar20 = (uint)(tVar2 == TOKT_METHOD);
    CTcTokenizer::next(in_stack_fffffffffffffd88);
  }
  tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x215e45);
  if (tVar2 != TOKT_SYM) {
    CTcTokenizer::log_error_curtok(in_stack_fffffffffffffd80,iVar5);
    return (CTPNStmTop *)(CTPNCodeBody *)0x0;
  }
  this_00 = &G_tok;
  pCVar8 = CTcTokenizer::copycur(in_stack_fffffffffffffd98);
  local_58 = pCVar8->field_0x20;
  local_78 = *(CTcSymFunc **)pCVar8;
  pCStack_70 = (CTcTokFileDesc *)pCVar8->text_;
  local_68 = (array_list_ele_t *)pCVar8->text_len_;
  pCStack_60 = (CTcTokFileDesc *)pCVar8->int_val_;
  CTcTokenizer::get_last_pos
            ((CTcTokenizer *)((CTcParser *)this_00)->ov_op_add_,
             (CTcTokFileDesc **)&stack0xffffffffffffff48,(long *)&stack0xffffffffffffff40);
  tVar2 = CTcTokenizer::next(in_stack_fffffffffffffd88);
  if ((tVar2 == TOKT_LPAR) || (tVar2 == TOKT_LBRACE)) {
    if (local_3c == 0) {
      in_stack_fffffffffffffd80 = (CTcTokenizer *)&stack0xffffffffffffff64;
      in_stack_fffffffffffffd88 = (CTcTokenizer *)&stack0xffffffffffffff58;
      in_stack_fffffffffffffd90 = (CTcPrsSymtab *)&stack0xffffffffffffff54;
      in_stack_fffffffffffffdc8 = (CTcSymFunc *)&stack0xffffffffffffff38;
      in_stack_fffffffffffffda0 = (CTcToken *)0x0;
      in_stack_fffffffffffffda8 = 0;
      in_stack_fffffffffffffdb0 = (CTcFormalTypeList *)0x0;
      in_stack_fffffffffffffdb8 = 0;
      in_stack_fffffffffffffdc0 = (char *)0x0;
      this_01 = parse_code_body((CTcParser *)this_00,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20)
                                ,(int)in_stack_fffffffffffffef0,
                                (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                                (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                                ,in_stack_fffffffffffffed8,
                                (int *)CONCAT44(uVar20,in_stack_ffffffffffffff30),
                                (int *)type_list_00,(CTcSymLocal **)in_stack_ffffffffffffff40,
                                &in_stack_ffffffffffffff48->index_,
                                (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                ,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
                                (propset_def *)
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                in_stack_ffffffffffffff70,
                                (CTcCodeBodyRef *)in_stack_ffffffffffffff78,
                                (CTcFormalTypeList **)in_stack_ffffffffffffff80);
    }
    else {
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x215fac);
      uVar7 = (uint)((ulong)in_stack_fffffffffffffd90 >> 0x20);
      if (tVar3 != TOKT_LPAR) {
        CTcTokenizer::log_error(0x2b5a);
        parse_code_body((CTcParser *)this_00,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                        (int)in_stack_fffffffffffffef0,
                        (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8,(int *)CONCAT44(uVar20,in_stack_ffffffffffffff30),
                        (int *)type_list_00,(CTcSymLocal **)in_stack_ffffffffffffff40,
                        &in_stack_ffffffffffffff48->index_,
                        (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
                        (propset_def *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                        ,in_stack_ffffffffffffff70,(CTcCodeBodyRef *)in_stack_ffffffffffffff78,
                        (CTcFormalTypeList **)in_stack_ffffffffffffff80);
        return (CTPNStmTop *)(CTPNCodeBody *)0x0;
      }
      CTcTokenizer::next(in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd80 = (CTcTokenizer *)&stack0xffffffffffffff58;
      in_stack_fffffffffffffda0 = (CTcToken *)&stack0xffffffffffffff38;
      in_stack_fffffffffffffd90 = (CTcPrsSymtab *)((ulong)uVar7 << 0x20);
      in_stack_fffffffffffffd88 = local_38;
      parse_formal_list((CTcParser *)CONCAT44(tVar2,in_stack_ffffffffffffff00),
                        (int)((ulong)this_00 >> 0x20),(int)this_00,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee8,
                        (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                        (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,type_list_00);
      iVar5 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x216044);
      if ((tVar2 == TOKT_LBRACE) ||
         (tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x216058), tVar2 == TOKT_EQ)) {
        CTcTokenizer::log_error(0x2b5a);
        parse_code_body((CTcParser *)this_00,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                        (int)in_stack_fffffffffffffef0,iVar5,
                        (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8,(int *)CONCAT44(uVar20,in_stack_ffffffffffffff30),
                        (int *)type_list_00,(CTcSymLocal **)in_stack_ffffffffffffff40,
                        &in_stack_ffffffffffffff48->index_,
                        (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
                        (propset_def *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                        ,in_stack_ffffffffffffff70,(CTcCodeBodyRef *)in_stack_ffffffffffffff78,
                        (CTcFormalTypeList **)in_stack_ffffffffffffff80);
        return (CTPNStmTop *)(CTPNCodeBody *)0x0;
      }
      parse_req_sem();
      this_01 = (CTPNCodeBody *)0x0;
    }
    if ((*(int *)local_38 != 0) || ((this_01 == (CTPNCodeBody *)0x0 && (local_3c == 0)))) {
      return (CTPNStmTop *)(CTPNCodeBody *)0x0;
    }
  }
  else {
    if (tVar2 != TOKT_SEM) {
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffd80,iVar5);
      return (CTPNStmTop *)(CTPNCodeBody *)0x0;
    }
    CTcTokenizer::next(in_stack_fffffffffffffd88);
    if (local_3c == 0) {
      return (CTPNStmTop *)(CTPNCodeBody *)0x0;
    }
    bVar1 = false;
    in_stack_ffffffffffffff70 = 0;
    in_stack_ffffffffffffff68 = NEWLINE_SPACING_DELETE;
    local_9c = 0;
    this_01 = (CTPNCodeBody *)0x0;
  }
  if (type_list_00 != (CTcFormalTypeList **)0x0) {
    CTcToken::get_text((CTcToken *)&local_78);
    CTcToken::get_text_len((CTcToken *)&local_78);
    pCVar9 = (CTcSymFunc *)
             CTcPrsSymtab::find_delete_weak
                       (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                        (size_t)in_stack_fffffffffffffd80);
    if (pCVar9 == (CTcSymFunc *)0x0) {
      pCVar9 = (CTcSymFunc *)CTcSymbolBase::operator_new(0x2164c5);
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffd80 >> 0x20);
      uVar16 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffffd90 >> 0x20);
      uVar18 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
      CTcToken::get_text((CTcToken *)&local_78);
      CTcToken::get_text_len((CTcToken *)&local_78);
      in_stack_fffffffffffffda0 = (CTcToken *)CONCAT44(uVar18,1);
      in_stack_fffffffffffffd90 = (CTcPrsSymtab *)CONCAT44(uVar17,1);
      in_stack_fffffffffffffd88 = (CTcTokenizer *)CONCAT44(uVar16,1);
      in_stack_fffffffffffffd80 = (CTcTokenizer *)CONCAT44(uVar15,1);
      CTcSymFunc::CTcSymFunc
                (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(int)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffdac,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe18);
      CTcSymFuncBase::set_mm_def((CTcSymFuncBase *)pCVar9,1);
      (**(code **)(**(long **)(in_RDI + 0x80) + 0x18))(*(long **)(in_RDI + 0x80),pCVar9);
    }
    else {
      tVar4 = CTcSymbolBase::get_type((CTcSymbolBase *)pCVar9);
      pCVar19 = G_tcmain;
      if (tVar4 == TC_SYM_FUNC) {
        iVar5 = CTcSymFuncBase::is_extern(&pCVar9->super_CTcSymFuncBase);
        if ((iVar5 == 0) ||
           (iVar5 = CTcSymFuncBase::is_multimethod(&pCVar9->super_CTcSymFuncBase), iVar5 == 0)) {
          pCVar19 = G_tcmain;
          sVar10 = CTcToken::get_text_len((CTcToken *)&local_78);
          pcVar11 = CTcToken::get_text((CTcToken *)&local_78);
          CTcMain::log_error(pCVar19,in_stack_ffffffffffffff48,(long)in_stack_ffffffffffffff40,
                             TC_SEV_ERROR,0x2bc8,sVar10 & 0xffffffff,pcVar11);
          return (CTPNStmTop *)(CTPNCodeBody *)0x0;
        }
      }
      else {
        pCVar21 = in_stack_ffffffffffffff40;
        pCVar22 = in_stack_ffffffffffffff48;
        sVar10 = CTcToken::get_text_len((CTcToken *)&local_78);
        uVar20 = (uint)sVar10;
        pcVar11 = CTcToken::get_text((CTcToken *)&local_78);
        CTcMain::log_error(pCVar19,in_stack_ffffffffffffff48,(long)in_stack_ffffffffffffff40,
                           TC_SEV_ERROR,0x2b58,(ulong)uVar20,pcVar11);
        in_stack_ffffffffffffff40 = pCVar21;
        in_stack_ffffffffffffff48 = pCVar22;
      }
    }
    CTcFormalTypeList::decorate_name
              (in_stack_fffffffffffffdb0,
               (CTcToken *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               in_stack_fffffffffffffda0);
  }
  CTcToken::get_text((CTcToken *)&local_78);
  CTcToken::get_text_len((CTcToken *)&local_78);
  pCVar9 = (CTcSymFunc *)
           CTcPrsSymtab::find_delete_weak
                     (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                      (size_t)in_stack_fffffffffffffd80);
  local_171 = 0;
  if (pCVar9 != (CTcSymFunc *)0x0) {
    tVar4 = CTcSymbolBase::get_type((CTcSymbolBase *)pCVar9);
    local_189 = 1;
    if (tVar4 == TC_SYM_FUNC) {
      iVar5 = CTcSymFuncBase::is_extern(&pCVar9->super_CTcSymFuncBase);
      local_18a = 0;
      if (((iVar5 == 0) && (local_18a = 0, local_3c == 0)) && (local_18a = 0, local_40 == 0)) {
        local_18a = local_44 != 0 ^ 0xff;
      }
      local_189 = local_18a;
    }
    local_171 = local_189;
  }
  uVar20 = (uint)(local_171 & 1);
  if (((bVar1) && (pCVar9 != (CTcSymFunc *)0x0)) &&
     (iVar5 = CTcSymFuncBase::has_proto(&pCVar9->super_CTcSymFuncBase), iVar5 != 0)) {
    iVar5 = CTcSymFuncBase::get_argc(&pCVar9->super_CTcSymFuncBase);
    local_18b = true;
    if (iVar5 == in_stack_ffffffffffffff70) {
      nVar6 = CTcSymFuncBase::is_varargs(&pCVar9->super_CTcSymFuncBase);
      local_18b = true;
      if (nVar6 == in_stack_ffffffffffffff68) {
        uVar7 = CTcSymFuncBase::is_multimethod(&pCVar9->super_CTcSymFuncBase);
        local_18b = uVar7 != (type_list_00 != (CTcFormalTypeList **)0x0);
      }
    }
    uVar20 = local_18b | uVar20;
  }
  if (uVar20 == 0) {
    if (pCVar9 == (CTcSymFunc *)0x0) {
      pCVar9 = (CTcSymFunc *)CTcSymbolBase::operator_new(0x2168d9);
      CTcToken::get_text((CTcToken *)&local_78);
      CTcToken::get_text_len((CTcToken *)&local_78);
      CTcSymFunc::CTcSymFunc
                (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(int)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffdac,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe18);
      (**(code **)(**(long **)(in_RDI + 0x80) + 0x18))(*(long **)(in_RDI + 0x80),pCVar9);
      if (((local_40 != 0) || (local_44 != 0)) && ((*(byte *)(in_RDI + 0xec) >> 2 & 1) == 0)) {
        CTcTokenizer::log_error(0x2b69);
      }
    }
    else {
      if (local_40 == 0) {
        if (local_44 != 0) {
          pCVar14 = (CTcSymFunc *)CTcSymbolBase::operator_new(0x216b5c);
          CTcSymFuncBase::is_multimethod(&pCVar9->super_CTcSymFuncBase);
          CTcSymFuncBase::is_multimethod_base(&pCVar9->super_CTcSymFuncBase);
          iVar5 = CTcSymFuncBase::is_extern(&pCVar9->super_CTcSymFuncBase);
          CTcSymFuncBase::has_proto(&pCVar9->super_CTcSymFuncBase);
          CTcSymFunc::CTcSymFunc
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(int)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffdac,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
                     in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,iVar5,(int)pCVar14);
          CTcSymFuncBase::set_mod_global(&pCVar14->super_CTcSymFuncBase,pCVar9);
          pCVar12 = CTcSymFuncBase::get_code_body(&pCVar9->super_CTcSymFuncBase);
          pCVar13 = pCVar14;
          if (pCVar12 != (CTPNCodeBody *)0x0) {
            pCVar12 = CTcSymFuncBase::get_code_body(&pCVar9->super_CTcSymFuncBase);
            pCVar13 = pCVar14;
            iVar5 = (*(pCVar14->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xc])();
            CTPNCodeBodyBase::set_symbol_fixup_list
                      (&pCVar12->super_CTPNCodeBodyBase,pCVar14,
                       (CTcAbsFixup **)CONCAT44(extraout_var,iVar5));
          }
          pCVar14 = pCVar13;
          pCVar12 = CTcSymFuncBase::get_code_body(&pCVar9->super_CTcSymFuncBase);
          CTcSymFuncBase::set_code_body(&pCVar13->super_CTcSymFuncBase,pCVar12);
          pCVar13 = pCVar14;
          f = CTcSymFuncBase::get_mod_base(&pCVar9->super_CTcSymFuncBase);
          CTcSymFuncBase::set_mod_base(&pCVar14->super_CTcSymFuncBase,f);
          CTcSymFuncBase::set_mod_base(&pCVar9->super_CTcSymFuncBase,pCVar13);
        }
      }
      else {
        iVar5 = CTcSymFuncBase::is_extern(&pCVar9->super_CTcSymFuncBase);
        if (iVar5 == 0) {
          pCVar12 = CTcSymFuncBase::get_code_body(&pCVar9->super_CTcSymFuncBase);
          if (pCVar12 != (CTPNCodeBody *)0x0) {
            pCVar12 = CTcSymFuncBase::get_code_body(&pCVar9->super_CTcSymFuncBase);
            CTPNCodeBodyBase::set_replaced(&pCVar12->super_CTPNCodeBodyBase,1);
          }
          for (pCVar13 = CTcSymFuncBase::get_mod_base(&pCVar9->super_CTcSymFuncBase);
              pCVar13 != (CTcSymFunc *)0x0;
              pCVar13 = CTcSymFuncBase::get_mod_base(&pCVar13->super_CTcSymFuncBase)) {
            iVar5 = CTcSymFuncBase::is_extern(&pCVar13->super_CTcSymFuncBase);
            if (iVar5 == 0) {
              pCVar12 = CTcSymFuncBase::get_code_body(&pCVar13->super_CTcSymFuncBase);
              if (pCVar12 != (CTPNCodeBody *)0x0) {
                pCVar12 = CTcSymFuncBase::get_code_body(&pCVar13->super_CTcSymFuncBase);
                CTPNCodeBodyBase::set_replaced(&pCVar12->super_CTPNCodeBodyBase,1);
              }
            }
            else {
              CTcSymFuncBase::set_ext_replace(&pCVar13->super_CTcSymFuncBase,1);
              CTcSymFuncBase::set_ext_replace(&pCVar9->super_CTcSymFuncBase,1);
            }
          }
          CTcSymFuncBase::set_mod_base(&pCVar9->super_CTcSymFuncBase,(CTcSymFunc *)0x0);
        }
        else {
          CTcSymFuncBase::set_ext_replace(&pCVar9->super_CTcSymFuncBase,1);
        }
      }
      if (local_3c == 0) {
        CTcSymFuncBase::set_extern(&pCVar9->super_CTcSymFuncBase,0);
      }
    }
    pCVar12 = this_01;
    pCVar13 = pCVar9;
    if (this_01 != (CTPNCodeBody *)0x0) {
      iVar5 = (*(pCVar9->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xc])();
      CTPNCodeBodyBase::set_symbol_fixup_list
                (&this_01->super_CTPNCodeBodyBase,pCVar9,
                 (CTcAbsFixup **)CONCAT44(extraout_var_00,iVar5));
    }
    CTcSymFuncBase::set_code_body(&pCVar13->super_CTcSymFuncBase,pCVar12);
    local_28 = pCVar12;
  }
  else {
    tVar4 = CTcSymbolBase::get_type((CTcSymbolBase *)pCVar9);
    if (tVar4 == TC_SYM_FUNC) {
      iVar5 = CTcSymFuncBase::is_extern(&pCVar9->super_CTcSymFuncBase);
      if ((((iVar5 == 0) && (local_3c == 0)) && (local_40 == 0)) && (local_44 == 0)) {
        uVar20 = 0x2b5b;
      }
      else {
        uVar20 = 0x2b5c;
      }
    }
    else {
      uVar20 = 0x2b58;
    }
    pCVar19 = G_tcmain;
    sVar10 = CTcToken::get_text_len((CTcToken *)&local_78);
    pcVar11 = CTcToken::get_text((CTcToken *)&local_78);
    CTcMain::log_error(pCVar19,in_stack_ffffffffffffff48,(long)in_stack_ffffffffffffff40,
                       TC_SEV_ERROR,(int)(ulong)uVar20,sVar10 & 0xffffffff,pcVar11);
    local_28 = (CTPNCodeBody *)0x0;
  }
  return (CTPNStmTop *)local_28;
}

Assistant:

CTPNStmTop *CTcParser::parse_function(int *err, int is_extern,
                                      int replace, int modify,
                                      int func_kw_present)
{
    CTcToken tok;
    CTcSymFunc *func_sym;
    CTPNCodeBody *code_body;
    int has_proto = TRUE;
    int argc;
    int opt_argc;
    int varargs;
    int varargs_list;
    CTcSymLocal *varargs_list_local;
    int has_retval;
    int redef;
    CTcTokFileDesc *sym_file;
    long sym_linenum;
    CTcFormalTypeList *type_list = 0;
    int is_method = FALSE;

    /* skip the 'function' or 'method' keyword, if present */
    if (func_kw_present)
    {
        /* note if it's a method definition */
        is_method = (G_tok->cur() == TOKT_METHOD);

        /* skip the token */
        G_tok->next();
    }

    /* we need a symbol */
    if (G_tok->cur() != TOKT_SYM)
    {
        /* log an error */
        G_tok->log_error_curtok(TCERR_FUNC_REQ_SYM);
        
        /* proceed from this token */
        return 0;
    }

    /* remember the symbol token */
    tok = *G_tok->copycur();

    /* remember the location of the symbol (for later error reporting) */
    G_tok->get_last_pos(&sym_file, &sym_linenum);

    /* 
     *   Skip past the function name.  If the next token is a semicolon,
     *   this is a forward declaration; otherwise, we need either an open
     *   brace or an argument list 
     */
    switch(G_tok->next())
    {
    case TOKT_SEM:
        /* it's just a forward declaration - skip the semicolon */
        G_tok->next();

        /* 
         *   if this is an 'extern' declaration, then declare the function
         *   as extern with zero arguments 
         */
        if (is_extern)
        {
            /* no prototype and no arguments */
            has_proto = FALSE;
            argc = 0;
            opt_argc = 0;
            varargs = FALSE;
            varargs_list = FALSE;

            /* assume it has a return value */
            has_retval = TRUE;

            /* no code body */
            code_body = 0;

            /* handle the declaration */
            goto decl_func;
        }

        /* 
         *   A non-extern forward declaration has no effect.  Ignore the
         *   definition and keep going. 
         */
        return 0;
        
    case TOKT_LPAR:
    case TOKT_LBRACE:
        /* 
         *   check whether this is an 'extern' declaration or the actual
         *   definition, and parse accordingly
         */
        if (is_extern)
        {
            /* 
             *   It's external - parse simply the formal parameter list.
             *   A brace is not allowed here. 
             */
            if (G_tok->cur() == TOKT_LPAR)
            {
                /* skip the paren */
                G_tok->next();

                /* parse the formals */
                parse_formal_list(TRUE, TRUE, &argc, &opt_argc, &varargs,
                                  &varargs_list, &varargs_list_local,
                                  err, 0, FALSE, &type_list);

                /* 
                 *   if it looks as though there's a code body, log an
                 *   error and skip and ignore the code body 
                 */
                if (G_tok->cur() == TOKT_LBRACE
                    || G_tok->cur() == TOKT_EQ)
                {
                    /* log the error */
                    G_tok->log_error(TCERR_EXTERN_NO_CODE_BODY);

                    /* parse and ignore the code body */
                    parse_code_body(FALSE, FALSE, FALSE,
                                    &argc, &opt_argc, &varargs,
                                    &varargs_list, &varargs_list_local,
                                    &has_retval, err, 0, TCPRS_CB_NORMAL,
                                    0, 0, 0, 0);

                    /* return failure */
                    return 0;
                }

                /* parse the required terminating semicolon */
                parse_req_sem();
            }
            else
            {
                /* code body is not allowed - log an error */
                G_tok->log_error(TCERR_EXTERN_NO_CODE_BODY);

                /* parse and ignore the code body */
                parse_code_body(FALSE, FALSE, is_method,
                                &argc, &opt_argc, &varargs,
                                &varargs_list, &varargs_list_local,
                                &has_retval, err, 0, TCPRS_CB_NORMAL,
                                0, 0, 0, 0);

                /* done */
                return 0;
            }

            /* there's no code body for an 'extern' definintion */
            code_body = 0;

            /* assume all externals return a value */
            has_retval = TRUE;
        }
        else
        {
            /*
             *   We're parsing the actual definition.  Parse the formal
             *   parameter list and the code body.  
             */
            code_body = parse_code_body(FALSE, FALSE, is_method,
                                        &argc, &opt_argc, &varargs,
                                        &varargs_list, &varargs_list_local,
                                        &has_retval, err, 0, TCPRS_CB_NORMAL,
                                        0, 0, 0, &type_list);
        }

        /* if that failed, do not go on */
        if (*err || (code_body == 0 && !is_extern))
            return 0;

    decl_func:
        /* if we have a type list, generate the decorated name */
        if (type_list != 0)
        {
            /*
             *   The function we're defining here will go by a decorated
             *   name, not the base name, since it's a particular version of
             *   this multi-method.  So, we need to replace the function name
             *   token with the decorated form, which incorporates the typed
             *   parameter list to distinguish this version from other
             *   multi-methods with the same base name and different
             *   parameter type lists.
             *   
             *   Before we generate the decorated name, though, define the
             *   base name as an external multi-method function, so that
             *   we'll know what to do when we see calls to the base
             *   function.  We define the base name as external because the
             *   current source code isn't actually a definition of the base
             *   name; the base name refers to an implied function that's not
             *   actually defined anywhere in the source code, but rather is
             *   generated automatically by the compiler.  As such, the
             *   source we're compiling effectively declares the existence of
             *   a function with the base name, but says that it will be
             *   defined elsewhere - this is, of course, the exact purpose of
             *   an external declaration.
             *   
             *   So, if the base name isn't yet defined, define it as an
             *   external function, and mark it as a multi-method.  Start by
             *   looking up the base function name.  
             */
            func_sym = (CTcSymFunc *)global_symtab_->find_delete_weak(
                tok.get_text(), tok.get_text_len());

            /* 
             *   if it's defined, make sure the existing definition is
             *   compatible; if it's not defined, define it now 
             */
            if (func_sym != 0)
            {
                /* 
                 *   it's previously defined: to be compatible, it has to be
                 *   an external, multi-method function 
                 */
                if (func_sym->get_type() != TC_SYM_FUNC)
                {
                    /* it's already defined as a non-function */
                    G_tcmain->log_error(
                        sym_file, sym_linenum,
                        TC_SEV_ERROR, TCERR_REDEF_AS_FUNC,
                        (int)tok.get_text_len(), tok.get_text());
                }
                else if (!(func_sym->is_extern()
                           && func_sym->is_multimethod()))
                {
                    /* it's already defined incompatibly - flag the error */
                    G_tcmain->log_error(
                        sym_file, sym_linenum,
                        TC_SEV_ERROR, TCERR_FUNC_REDEF_AS_MULTIMETHOD,
                        (int)tok.get_text_len(), tok.get_text());

                    /* ignore the redefinition */
                    return 0;
                }
            }
            else
            {
                /* 
                 *   It's not defined yet, so add it as an external
                 *   multi-method function.  This base form is always a
                 *   varargs function with no fixed arguments, since the
                 *   parameter lists of the different definitions can vary.
                 *   We'll likewise assume that there's a return value, since
                 *   some instances might have returns.  
                 */
                func_sym = new CTcSymFunc(tok.get_text(), tok.get_text_len(),
                                          FALSE, 0, 0, TRUE, TRUE,
                                          TRUE, TRUE, TRUE, TRUE);

                /* 
                 *   Mark the function symbol as defined in this file.  This
                 *   will ensure that we export it to our symbol file, even
                 *   though it's defined here as an extern symbol.  We don't
                 *   normally export externs, since we'd simply count on the
                 *   defining file to export them; but the base symbol for a
                 *   multi-method has no definer at all until link time, so
                 *   *someone* needs to export it.  So export it from any
                 *   file that defines a multi-method with the base name.  
                 */
                func_sym->set_mm_def(TRUE);

                /* add it to the symbol table */
                global_symtab_->add_entry(func_sym);
            }

            /* 
             *   Now we can generate the decorated name.  This name
             *   distinguishes this type-list version of the function from
             *   other versions with the same base name, and is the name by
             *   which the actual function definition will be known.  We'll
             *   also operate on the decorated name for 'replace' or
             *   'modify', since what we're replacing or modifying is this
             *   specific type-list version of the function.  
             */
            type_list->decorate_name(&tok, &tok);
        }

        /* find any existing function symbol */
        func_sym = (CTcSymFunc *)global_symtab_->find_delete_weak(
            tok.get_text(), tok.get_text_len());

        /* 
         *   If the symbol was already defined, the previous definition must
         *   be external, or this new definition must be external, or the new
         *   definition must be a 'replace' definition.
         */
        redef = (func_sym != 0
                 && (func_sym->get_type() != TC_SYM_FUNC
                     || (!func_sym->is_extern()
                         && !is_extern && !replace && !modify)));

        /* 
         *   In addition, if both function definitions have prototypes, the
         *   prototypes must match. 
         */
        if (has_proto && func_sym != 0 && func_sym->has_proto())
        {
            redef |= (func_sym->get_argc() != argc
                      || func_sym->is_varargs() != varargs
                      || func_sym->is_multimethod() != (type_list != 0));
        }

        /* 
         *   If the symbol was already defined, log an error, then ignore
         *   the redefinition and return an empty statement.  Note that we
         *   waited until now because we still wanted to parse the syntax
         *   of the function, but we can't really do anything with it once
         *   we're finished with the parsing.  
         */
        if (redef)
        {
            int err;
            
            /* 
             *   Note the problem.  Select the error message to display
             *   depending on whether the symbol was previously defined as
             *   a function (in which case the problem is the conflicting
             *   prototype) or as another type.  
             */
            if (func_sym->get_type() == TC_SYM_FUNC)
            {
                /* 
                 *   if one or the other definition is external, or we're
                 *   replacing the function, the problem is a mismatch in
                 *   the parameter lists; otherwise, the problem is that
                 *   the function is simply defined twice 
                 */
                if (func_sym->is_extern() || is_extern || replace || modify)
                    err = TCERR_INCOMPAT_FUNC_REDEF;
                else
                    err = TCERR_FUNC_REDEF;
            }
            else
            {
                /* it's being redefined as a new type */
                err = TCERR_REDEF_AS_FUNC;
            }

            /* log the error (at the symbol's position) */
            G_tcmain->log_error(sym_file, sym_linenum, TC_SEV_ERROR, err,
                                (int)tok.get_text_len(), tok.get_text());

            /* ignore the re-definition */
            return 0;
        }

        /* 
         *   create a symbol table entry for the function if we didn't
         *   have on already 
         */
        if (func_sym == 0)
        {
            /* we didn't have a symbol previously - create one */
            func_sym = new CTcSymFunc(tok.get_text(), tok.get_text_len(),
                                      FALSE, argc, opt_argc, varargs,
                                      has_retval, type_list != 0,
                                      FALSE, is_extern, has_proto);

            /* add the entry to the global symbol table */
            global_symtab_->add_entry(func_sym);

            /* 
             *   We can't replace/modify a function that wasn't previously
             *   defined - if we're replacing it, note the error.  Don't
             *   bother with this check if we're parsing only for syntax.  
             */
            if ((replace || modify) && !syntax_only_)
                G_tok->log_error(TCERR_REPFUNC_UNDEF);
        }
        else
        {
            /* replace or modify the previous definition if appropriate */
            if (replace)
            {
                /* 
                 *   check to see whether it's external or previously
                 *   defined in the same translation unit 
                 */
                if (func_sym->is_extern())
                {
                    /* 
                     *   The function was previously external, and we're
                     *   replacing it -- mark it as such so that we'll
                     *   know to perform the replacement at link time.  We
                     *   only need to do this when replacing an external
                     *   function, because if the function is defined in
                     *   the same translation unit then the replacement
                     *   will be completed right now, and we don't need to
                     *   do any more work at link time.  
                     */
                    func_sym->set_ext_replace(TRUE);
                }
                else
                {
                    CTcSymFunc *mod_base;

                    /*
                     *   The function was previously defined in the same
                     *   translation unit.  Mark the previous code body as
                     *   replaced so that we don't bother generating any
                     *   code for it. 
                     */
                    if (func_sym->get_code_body() != 0)
                        func_sym->get_code_body()->set_replaced(TRUE);

                    /*
                     *   If the function we're replacing modifies any base
                     *   functions, we're effectively replacing all of the
                     *   base functions as well.  None of these functions
                     *   will be reachable, since a modified base function is
                     *   only reachable through its modifying function; since
                     *   the function we're replacing is becoming
                     *   unreachable, therefore, all of its base functions
                     *   are as well.  
                     */
                    for (mod_base = func_sym->get_mod_base() ; mod_base != 0 ;
                         mod_base = mod_base->get_mod_base())
                    {
                        /* mark this base function as replaced */
                        if (mod_base->is_extern())
                        {
                            /* mark it as a replaced extern */
                            mod_base->set_ext_replace(TRUE);

                            /* note that our function replaces an external */
                            func_sym->set_ext_replace(TRUE);
                        }
                        else if (mod_base->get_code_body() != 0)
                        {
                            /* mark its code body as replaced */
                            mod_base->get_code_body()->set_replaced(TRUE);
                        }
                    }

                    /* 
                     *   since we're replacing the function, it no longer
                     *   has any modified base functions 
                     */
                    func_sym->set_mod_base(0);
                }
            }
            else if (modify)
            {
                CTcSymFunc *mod_sym;

                /* 
                 *   Create a new dummy symbol for the original version.
                 *   This symbol doesn't go in the symbol table; instead, we
                 *   link it into our modified base function list behind the
                 *   symbol table entry.
                 *   
                 *   The name is important, though: we have to give this an
                 *   empty name so that the object file reader will know that
                 *   this isn't an actual global symbol.  This will let the
                 *   object file loader's code stream reader know that it
                 *   can't fix up references to the code stream anchor by
                 *   looking at the global symbol table.  (We have to write
                 *   some extra code in the function symbol loader to deal
                 *   with this, since the code stream reader can't.)
                 *   
                 *   Note that we want the new base function symbol to keep
                 *   the same 'extern' attribute as the original symbol.  If
                 *   we're modifying an external function, this will allow us
                 *   to apply the modification at link time between this
                 *   module and the module where the imported original
                 *   function was defined.  
                 */
                mod_sym = new CTcSymFunc("", 0, FALSE,
                                         argc, opt_argc, varargs, has_retval,
                                         func_sym->is_multimethod(),
                                         func_sym->is_multimethod_base(),
                                         func_sym->is_extern(),
                                         func_sym->has_proto());

                /* 
                 *   remember the original global function in the modified
                 *   placeholder symbol 
                 */
                mod_sym->set_mod_global(func_sym);

                /* 
                 *   If the original has a code body, switch the code body to
                 *   use our new symbol's fixup list.
                 *   
                 *   The only way to reference the original code body is
                 *   through a 'replaced()' call in the modifying function,
                 *   so any fixups currently associated with the function
                 *   symbol should remain with the function symbol - in other
                 *   words, we don't have to move any existing fixups
                 *   anywhere.  
                 */
                if (func_sym->get_code_body() != 0)
                    func_sym->get_code_body()->set_symbol_fixup_list(
                        mod_sym, mod_sym->get_fixup_list_anchor());

                /* transfer the old code body to the modified base symbol */
                mod_sym->set_code_body(func_sym->get_code_body());

                /* 
                 *   put the new modified base function at the head of the
                 *   modified base list 
                 */
                mod_sym->set_mod_base(func_sym->get_mod_base());
                func_sym->set_mod_base(mod_sym);
            }
            
            /* 
             *   The function was already defined.  If this is an actual
             *   definition (not an 'extern' declaration), then clear the
             *   'extern' flag on the existing symbol.  
             */
            if (!is_extern)
                func_sym->set_extern(FALSE);
        }

        /* 
         *   If there's a code body, tell the code body about its symbol
         *   table entry.  (If the function is 'extern' it has no code
         *   body at this point.)  
         */
        if (code_body != 0)
            code_body->set_symbol_fixup_list(
                func_sym, func_sym->get_fixup_list_anchor());

        /* tell the function about its code body */
        func_sym->set_code_body(code_body);

        /* return the code body as the result */
        return code_body;

    default:
        /* log an error and continue from here */
        G_tok->log_error_curtok(TCERR_REQ_CODE_BODY);
        return 0;
    }
}